

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_Test::testBody
          (TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_Test *this)

{
  MemoryLeakDetector *pMVar1;
  SimpleString *pSVar2;
  bool bVar3;
  TestMemoryAllocator *pTVar4;
  UtestShell *pUVar5;
  TestTerminator *pTVar6;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  char *local_18;
  char *mem;
  TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_Test *this_local;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  mem = (char *)this;
  pTVar4 = defaultNewArrayAllocator();
  local_18 = MemoryLeakDetector::allocMemory(pMVar1,pTVar4,100,"ALLOC.c",10,false);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector;
  pTVar4 = defaultMallocAllocator();
  MemoryLeakDetector::deallocMemory(pMVar1,pTVar4,local_18,"FREE.c",100,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pUVar5 = UtestShell::getCurrent();
  pSVar2 = ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).reporter)->message;
  SimpleString::SimpleString(&local_28,"Allocation/deallocation type mismatch");
  bVar3 = SimpleString::contains(pSVar2,&local_28);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[8])
            (pUVar5,(ulong)bVar3,"CHECK",
             "reporter->message->contains(\"Allocation/deallocation type mismatch\")",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x180,pTVar6);
  SimpleString::~SimpleString(&local_28);
  pUVar5 = UtestShell::getCurrent();
  pSVar2 = ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).reporter)->message;
  SimpleString::SimpleString
            (local_48,"   allocated at file: ALLOC.c line: 10 size: 100 type: new []");
  bVar3 = SimpleString::contains(pSVar2,local_48);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[8])
            (pUVar5,(ulong)bVar3,"CHECK",
             "reporter->message->contains(\"   allocated at file: ALLOC.c line: 10 size: 100 type: new []\")"
             ,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x181,pTVar6);
  SimpleString::~SimpleString(local_48);
  pUVar5 = UtestShell::getCurrent();
  pSVar2 = ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).reporter)->message;
  SimpleString::SimpleString(&local_58,"   deallocated at file: FREE.c line: 100 type: free");
  bVar3 = SimpleString::contains(pSVar2,&local_58);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[8])
            (pUVar5,(ulong)bVar3,"CHECK",
             "reporter->message->contains(\"   deallocated at file: FREE.c line: 100 type: free\")",
             0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x182,pTVar6);
  SimpleString::~SimpleString(&local_58);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, AllocOneTypeFreeAnotherType)
{
    char* mem = detector->allocMemory(defaultNewArrayAllocator(), 100, "ALLOC.c", 10);
    detector->deallocMemory(defaultMallocAllocator(), mem, "FREE.c", 100);
    detector->stopChecking();
    CHECK(reporter->message->contains("Allocation/deallocation type mismatch"));
    CHECK(reporter->message->contains("   allocated at file: ALLOC.c line: 10 size: 100 type: new []"));
    CHECK(reporter->message->contains("   deallocated at file: FREE.c line: 100 type: free"));
}